

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  float fVar1;
  pointer ppMVar2;
  long *plVar3;
  Accessor *pAVar4;
  Tangent *pTVar5;
  uint uVar6;
  uint c_00;
  uint uVar7;
  uint uVar8;
  pointer pPVar9;
  aiMesh *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  aiVector3D *paVar12;
  Logger *pLVar13;
  float *pfVar14;
  aiAnimMesh **ppaVar15;
  aiAnimMesh *paVar16;
  undefined8 *puVar17;
  aiFace *paVar18;
  aiFace *paVar19;
  ulong uVar20;
  int b;
  size_t i_1;
  ulong *puVar21;
  uint vertexId_2;
  int iVar22;
  int iVar23;
  long lVar24;
  uint i;
  uint *puVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  size_t c;
  Tangent *pTVar29;
  ulong *puVar30;
  ulong *puVar31;
  Mesh *pMVar32;
  aiVector3t<float> aVar33;
  aiMesh *aim;
  ulong *local_f0;
  aiFace *local_e8;
  uint *local_e0;
  uint k;
  Tangent *tangents;
  uint8_t *local_c8;
  ulong *local_b0;
  Mesh *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  glTF2Importer *local_90;
  ulong local_88;
  ulong local_80;
  aiVector3D *tangentDiff;
  Asset *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  k = 0;
  local_98 = &this->meshOffsets;
  uVar27 = 0;
  local_90 = this;
  local_58 = r;
  do {
    ppMVar2 = (local_58->meshes).mObjs.
              super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((ulong)((long)(local_58->meshes).mObjs.
                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3 & 0xffffffff) <=
        uVar27) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_98,&k);
      BaseImporter::CopyVector<aiMesh*>
                (&meshes,&local_90->mScene->mMeshes,&local_90->mScene->mNumMeshes);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      return;
    }
    pMVar32 = ppMVar2[uVar27];
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_98,&k);
    lVar24 = *(long *)&(pMVar32->primitives).
                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                       ._M_impl.super__Vector_impl_data;
    pPVar9 = *(pointer *)
              ((long)&(pMVar32->primitives).
                      super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                      ._M_impl + 8);
    k = k + (int)((ulong)((long)pPVar9 - lVar24) >> 8);
    local_a0 = &(pMVar32->super_Object).name;
    local_50 = &(pMVar32->super_Object).id;
    uVar6 = 0;
    local_a8 = pMVar32;
    local_88 = uVar27;
    while (local_80 = (ulong)uVar6, local_80 < (ulong)((long)pPVar9 - lVar24 >> 8)) {
      paVar10 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar10);
      aim = paVar10;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&aim);
      paVar10 = aim;
      pbVar11 = local_a0;
      if ((pMVar32->super_Object).name._M_string_length == 0) {
        pbVar11 = local_50;
      }
      uVar27 = pbVar11->_M_string_length;
      if (uVar27 < 0x400) {
        (aim->mName).length = (ai_uint32)uVar27;
        memcpy((aim->mName).data,(pbVar11->_M_dataplus)._M_p,uVar27);
        (paVar10->mName).data[uVar27] = '\0';
      }
      uVar27 = local_80;
      paVar10 = aim;
      if (0x100 < (ulong)((long)*(pointer *)
                                 ((long)&(pMVar32->primitives).
                                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                         ._M_impl + 8) -
                         *(long *)&(pMVar32->primitives).
                                   super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                   ._M_impl.super__Vector_impl_data)) {
        uVar6 = (aim->mName).length;
        (aim->mName).data[uVar6] = '-';
        uVar6 = ASSIMP_itoa10((aim->mName).data + (ulong)uVar6 + 1,0x3ff - uVar6,(int32_t)local_80);
        (paVar10->mName).length = uVar6 + (paVar10->mName).length + 1;
      }
      puVar25 = (uint *)(lVar24 + uVar27 * 0x100);
      if ((ulong)*puVar25 < 7) {
        aim->mPrimitiveTypes = aim->mPrimitiveTypes | *(uint *)(&DAT_0060e93c + (ulong)*puVar25 * 4)
        ;
      }
      plVar3 = *(long **)(puVar25 + 2);
      if ((*(long **)(puVar25 + 4) != plVar3) && ((long *)*plVar3 != (long *)0x0)) {
        aim->mNumVertices =
             *(uint *)(*(long *)(*(long *)*plVar3 + (ulong)*(uint *)(plVar3 + 1) * 8) + 0x70);
        glTF2::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)
                    (*(long *)**(undefined8 **)(puVar25 + 2) +
                    (ulong)*(uint *)(*(undefined8 **)(puVar25 + 2) + 1) * 8),&aim->mVertices);
      }
      plVar3 = *(long **)(puVar25 + 8);
      local_e0 = puVar25;
      if ((*(long **)(puVar25 + 10) != plVar3) && ((long *)*plVar3 != (long *)0x0)) {
        glTF2::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)(*(long *)*plVar3 + (ulong)*(uint *)(plVar3 + 1) * 8),
                   &aim->mNormals);
        plVar3 = *(long **)(puVar25 + 0xe);
        if ((*(long **)(puVar25 + 0x10) != plVar3) && ((long *)*plVar3 != (long *)0x0)) {
          tangents = (Tangent *)0x0;
          glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                    (*(Accessor **)(*(long *)*plVar3 + (ulong)*(uint *)(plVar3 + 1) * 8),&tangents);
          paVar10 = aim;
          uVar6 = aim->mNumVertices;
          uVar27 = (ulong)uVar6 * 0xc;
          paVar12 = (aiVector3D *)operator_new__(uVar27);
          if (uVar6 != 0) {
            uVar27 = uVar27 - 0xc;
            memset(paVar12,0,(uVar27 - uVar27 % 0xc) + 0xc);
          }
          paVar10->mTangents = paVar12;
          uVar6 = paVar10->mNumVertices;
          uVar27 = (ulong)uVar6 * 0xc;
          paVar12 = (aiVector3D *)operator_new__(uVar27);
          if (uVar6 != 0) {
            uVar27 = uVar27 - 0xc;
            memset(paVar12,0,(uVar27 - uVar27 % 0xc) + 0xc);
          }
          pTVar5 = tangents;
          paVar10->mBitangents = paVar12;
          lVar24 = 0;
          pTVar29 = tangents;
          for (uVar27 = 0; uVar27 < paVar10->mNumVertices; uVar27 = uVar27 + 1) {
            paVar12 = paVar10->mTangents;
            *(float *)((long)&paVar12->z + lVar24) = (pTVar29->xyz).z;
            *(undefined8 *)((long)&paVar12->x + lVar24) = *(undefined8 *)&pTVar29->xyz;
            aVar33 = operator^((aiVector3t<float> *)((long)&paVar10->mNormals->x + lVar24),
                               &pTVar29->xyz);
            fVar1 = pTVar29->w;
            paVar12 = aim->mBitangents;
            *(ulong *)((long)&paVar12->x + lVar24) = CONCAT44(aVar33.y * fVar1,aVar33.x * fVar1);
            *(float *)((long)&paVar12->z + lVar24) = aVar33.z * fVar1;
            pTVar29 = pTVar29 + 1;
            lVar24 = lVar24 + 0xc;
            paVar10 = aim;
          }
          if (pTVar5 != (Tangent *)0x0) {
            operator_delete__(pTVar5);
          }
        }
      }
      lVar24 = 0x30;
      for (uVar27 = 0;
          (uVar27 < 8 &&
          (lVar28 = *(long *)(local_e0 + 0x1a),
          uVar27 < (ulong)(*(long *)(local_e0 + 0x1c) - lVar28 >> 4))); uVar27 = uVar27 + 1) {
        pAVar4 = *(Accessor **)
                  (**(long **)(lVar28 + -0x60 + lVar24 * 2) +
                  (ulong)*(uint *)(lVar28 + -0x58 + lVar24 * 2) * 8);
        if (pAVar4->count == (ulong)aim->mNumVertices) {
          glTF2::Accessor::ExtractData<aiColor4t<float>>
                    (pAVar4,(aiColor4t<float> **)((long)aim->mColors + lVar24 + -0x30));
        }
        else {
          pLVar13 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"Color stream size in mesh \"",local_a0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangents,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"\" does not match the vertex count");
          Logger::warn(pLVar13,(char *)tangents);
          std::__cxx11::string::~string((string *)&tangents);
          std::__cxx11::string::~string((string *)&tangentDiff);
        }
        lVar24 = lVar24 + 8;
      }
      for (uVar27 = 0;
          (paVar10 = aim, uVar27 < 8 &&
          (lVar24 = *(long *)(local_e0 + 0x14),
          uVar27 < (ulong)(*(long *)(local_e0 + 0x16) - lVar24 >> 4))); uVar27 = uVar27 + 1) {
        lVar28 = uVar27 * 0x10;
        pAVar4 = *(Accessor **)
                  (**(long **)(lVar24 + lVar28) + (ulong)*(uint *)(lVar24 + 8 + lVar28) * 8);
        if (pAVar4->count == (ulong)aim->mNumVertices) {
          glTF2::Accessor::ExtractData<aiVector3t<float>>(pAVar4,aim->mTextureCoords + uVar27);
          aim->mNumUVComponents[uVar27] =
               *(uint *)(&DAT_007594a8 +
                        (ulong)*(uint *)(*(long *)(**(long **)(*(long *)(local_e0 + 0x14) + lVar28)
                                                  + (ulong)*(uint *)(*(long *)(local_e0 + 0x14) + 8
                                                                    + lVar28) * 8) + 0x78) * 0x10);
          pfVar14 = &aim->mTextureCoords[uVar27]->y;
          for (uVar20 = 0; uVar20 < aim->mNumVertices; uVar20 = uVar20 + 1) {
            *pfVar14 = 1.0 - *pfVar14;
            pfVar14 = pfVar14 + 3;
          }
        }
        else {
          pLVar13 = DefaultLogger::get();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"Texcoord stream size in mesh \"",local_a0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangents,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tangentDiff,"\" does not match the vertex count");
          Logger::warn(pLVar13,(char *)tangents);
          std::__cxx11::string::~string((string *)&tangents);
          std::__cxx11::string::~string((string *)&tangentDiff);
        }
      }
      if (*(long *)(local_e0 + 0x3c) - *(long *)(local_e0 + 0x3a) != 0) {
        uVar27 = (*(long *)(local_e0 + 0x3c) - *(long *)(local_e0 + 0x3a)) / 0x48;
        aim->mNumAnimMeshes = (uint)uVar27;
        ppaVar15 = (aiAnimMesh **)operator_new__((uVar27 & 0xffffffff) << 3);
        paVar10->mAnimMeshes = ppaVar15;
        for (uVar27 = 0;
            uVar27 < (ulong)((*(long *)(local_e0 + 0x3c) - *(long *)(local_e0 + 0x3a)) / 0x48);
            uVar27 = uVar27 + 1) {
          paVar16 = aiCreateAnimMesh(aim);
          aim->mAnimMeshes[uVar27] = paVar16;
          paVar16 = aim->mAnimMeshes[uVar27];
          lVar24 = *(long *)(local_e0 + 0x3a);
          lVar28 = uVar27 * 0x48;
          plVar3 = (long *)(lVar24 + lVar28);
          if (*(long *)(lVar24 + 8 + lVar28) != *(long *)(lVar24 + lVar28)) {
            tangents = (Tangent *)0x0;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (**(long **)*plVar3 + (ulong)*(uint *)((undefined8 *)*plVar3 + 1) * 8),
                       (aiVector3t<float> **)&tangents);
            lVar24 = 0;
            for (uVar20 = 0; uVar20 < aim->mNumVertices; uVar20 = uVar20 + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)((long)&paVar16->mVertices->x + lVar24),
                         (aiVector3t<float> *)((long)&(tangents->xyz).x + lVar24));
              lVar24 = lVar24 + 0xc;
            }
            if (tangents != (Tangent *)0x0) {
              operator_delete__(tangents);
            }
          }
          if (plVar3[4] != plVar3[3]) {
            tangents = (Tangent *)0x0;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (**(long **)plVar3[3] + (ulong)*(uint *)((undefined8 *)plVar3[3] + 1) * 8),
                       (aiVector3t<float> **)&tangents);
            lVar24 = 0;
            for (uVar20 = 0; uVar20 < aim->mNumVertices; uVar20 = uVar20 + 1) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)((long)&paVar16->mNormals->x + lVar24),
                         (aiVector3t<float> *)((long)&(tangents->xyz).x + lVar24));
              lVar24 = lVar24 + 0xc;
            }
            if (tangents != (Tangent *)0x0) {
              operator_delete__(tangents);
            }
          }
          if (plVar3[7] != plVar3[6]) {
            tangents = (Tangent *)0x0;
            glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                      (*(Accessor **)
                        (*(long *)**(undefined8 **)(local_e0 + 0xe) +
                        (ulong)*(uint *)(*(undefined8 **)(local_e0 + 0xe) + 1) * 8),&tangents);
            tangentDiff = (aiVector3D *)0x0;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (**(long **)plVar3[6] + (ulong)*(uint *)((undefined8 *)plVar3[6] + 1) * 8),
                       &tangentDiff);
            pTVar5 = tangents;
            lVar24 = 0;
            pTVar29 = tangents;
            for (uVar20 = 0; uVar20 < aim->mNumVertices; uVar20 = uVar20 + 1) {
              aiVector3t<float>::operator+=
                        (&pTVar29->xyz,(aiVector3t<float> *)((long)&tangentDiff->x + lVar24));
              paVar12 = paVar16->mTangents;
              *(undefined8 *)((long)&paVar12->x + lVar24) = *(undefined8 *)&pTVar29->xyz;
              *(float *)((long)&paVar12->z + lVar24) = (pTVar29->xyz).z;
              aVar33 = operator^((aiVector3t<float> *)((long)&paVar16->mNormals->x + lVar24),
                                 &pTVar29->xyz);
              fVar1 = pTVar29->w;
              paVar12 = paVar16->mBitangents;
              *(ulong *)((long)&paVar12->x + lVar24) = CONCAT44(aVar33.y * fVar1,aVar33.x * fVar1);
              *(float *)((long)&paVar12->z + lVar24) = aVar33.z * fVar1;
              lVar24 = lVar24 + 0xc;
              pTVar29 = pTVar29 + 1;
            }
            if (pTVar5 != (Tangent *)0x0) {
              operator_delete__(pTVar5);
            }
            if (tangentDiff != (aiVector3D *)0x0) {
              operator_delete__(tangentDiff);
            }
          }
          lVar24 = *(long *)&(local_a8->weights).super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data;
          if (uVar27 < (ulong)((long)*(pointer *)
                                      ((long)&(local_a8->weights).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl + 8) - lVar24 >> 2)) {
            paVar16->mWeight = *(float *)(lVar24 + uVar27 * 4);
          }
        }
      }
      pMVar32 = local_a8;
      if (*(long **)(local_e0 + 0x32) != (long *)0x0) {
        pAVar4 = *(Accessor **)(**(long **)(local_e0 + 0x32) + (ulong)local_e0[0x34] * 8);
        puVar30 = (ulong *)pAVar4->count;
        glTF2::Accessor::Indexer::Indexer((Indexer *)&tangents,pAVar4);
        if (local_c8 == (uint8_t *)0x0) {
          __assert_fail("data.IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                        ,0x1e3,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
        }
        pMVar32 = local_a8;
        switch(*local_e0) {
        case 0:
          uVar27 = (long)puVar30 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar30) {
            uVar27 = 0xffffffffffffffff;
          }
          puVar31 = (ulong *)operator_new__(uVar27);
          *puVar31 = (ulong)puVar30;
          paVar19 = (aiFace *)(puVar31 + 1);
          if (puVar30 != (ulong *)0x0) {
            paVar18 = paVar19;
            do {
              paVar18->mNumIndices = 0;
              paVar18->mIndices = (uint *)0x0;
              paVar18 = paVar18 + 1;
            } while (paVar18 != paVar19 + (long)puVar30);
          }
          for (uVar6 = 0; puVar31 = puVar30, (ulong *)(ulong)uVar6 < puVar30; uVar6 = uVar6 + 1) {
            uVar7 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,uVar6);
            SetFace(paVar19 + (long)(ulong)uVar6,uVar7);
          }
          break;
        case 1:
          puVar21 = puVar30;
          if ((ulong *)((ulong)puVar30 & 0xfffffffffffffffe) != puVar30) {
            pLVar13 = DefaultLogger::get();
            Logger::warn(pLVar13,
                         "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                        );
            puVar21 = (ulong *)((ulong)puVar30 & 0xfffffffffffffffe);
          }
          puVar31 = (ulong *)((ulong)puVar30 >> 1);
          local_f0 = puVar31;
          puVar17 = (undefined8 *)
                    operator_new__(-(ulong)((ulong)puVar30 >> 0x3d != 0) | (long)puVar31 * 0x10 | 8)
          ;
          *puVar17 = local_f0;
          paVar19 = (aiFace *)(puVar17 + 1);
          if ((ulong *)0x1 < puVar30) {
            paVar18 = paVar19;
            do {
              paVar18->mNumIndices = 0;
              paVar18->mIndices = (uint *)0x0;
              paVar18 = paVar18 + 1;
            } while (paVar18 != paVar19 + (long)puVar31);
          }
          puVar30 = (ulong *)0x0;
          while (iVar22 = (int)puVar30, puVar31 = local_f0, puVar30 < puVar21) {
            uVar6 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,iVar22);
            uVar7 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,iVar22 + 1);
            SetFace(paVar19 + ((ulong)puVar30 >> 1),uVar6,uVar7);
            puVar30 = (ulong *)(ulong)(iVar22 + 2);
          }
          break;
        case 2:
        case 3:
          puVar31 = (ulong *)((long)puVar30 - (ulong)(*local_e0 == 3));
          uVar27 = (long)puVar31 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar31) {
            uVar27 = 0xffffffffffffffff;
          }
          local_f0 = puVar31;
          puVar17 = (undefined8 *)operator_new__(uVar27);
          *puVar17 = local_f0;
          paVar19 = (aiFace *)(puVar17 + 1);
          if (local_f0 != (ulong *)0x0) {
            paVar18 = paVar19;
            do {
              paVar18->mNumIndices = 0;
              paVar18->mIndices = (uint *)0x0;
              paVar18 = paVar18 + 1;
            } while (paVar18 != paVar19 + (long)puVar31);
          }
          uVar6 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,0);
          uVar7 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,1);
          SetFace(paVar19,uVar6,uVar7);
          puVar31 = (ulong *)0x2;
          while (iVar22 = (int)puVar31, puVar31 < puVar30) {
            iVar23 = *(int *)(puVar17[(ulong)(iVar22 - 2) * 2 + 2] + 4);
            uVar6 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,iVar22);
            SetFace(paVar19 + (iVar22 - 1),iVar23,uVar6);
            puVar31 = (ulong *)(ulong)(iVar22 + 1);
          }
          puVar31 = local_f0;
          if (*local_e0 == 2) {
            SetFace(paVar19 + ((long)puVar30 - 1),paVar19[(long)puVar30 - 2].mIndices[1],
                    *(int *)puVar17[2]);
            puVar31 = local_f0;
          }
          break;
        case 4:
          local_f0 = (ulong *)((ulong)puVar30 / 3);
          puVar31 = (ulong *)((long)local_f0 * 3);
          local_b0 = puVar30;
          if (puVar31 != puVar30) {
            pLVar13 = DefaultLogger::get();
            Logger::warn(pLVar13,
                         "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                        );
            local_b0 = puVar31;
          }
          puVar31 = local_f0;
          uVar27 = (long)local_f0 * 0x10 + 8;
          if (2 < (uint)((ulong)puVar30 >> 0x3c)) {
            uVar27 = 0xffffffffffffffff;
          }
          puVar17 = (undefined8 *)operator_new__(uVar27);
          *puVar17 = local_f0;
          paVar19 = (aiFace *)(puVar17 + 1);
          if ((ulong *)0x2 < puVar30) {
            paVar18 = paVar19;
            do {
              paVar18->mNumIndices = 0;
              paVar18->mIndices = (uint *)0x0;
              paVar18 = paVar18 + 1;
            } while (paVar18 != paVar19 + (long)puVar31);
          }
          puVar30 = (ulong *)0x0;
          while (iVar22 = (int)puVar30, puVar31 = local_f0, puVar30 < local_b0) {
            uVar6 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,iVar22);
            uVar7 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,iVar22 + 1);
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,iVar22 + 2);
            SetFace(paVar19 + (ulong)puVar30 / 3,uVar6,uVar7,uVar8);
            puVar30 = (ulong *)(ulong)(iVar22 + 3);
          }
          break;
        case 5:
          puVar30 = (ulong *)((long)puVar30 - 2);
          uVar27 = (long)puVar30 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar30) {
            uVar27 = 0xffffffffffffffff;
          }
          local_f0 = puVar30;
          puVar17 = (undefined8 *)operator_new__(uVar27);
          *puVar17 = local_f0;
          local_e8 = (aiFace *)(puVar17 + 1);
          if (local_f0 != (ulong *)0x0) {
            paVar19 = local_e8;
            do {
              paVar19->mNumIndices = 0;
              paVar19->mIndices = (uint *)0x0;
              paVar19 = paVar19 + 1;
            } while (paVar19 != local_e8 + (long)puVar30);
          }
          uVar6 = 1;
          puVar30 = (ulong *)0x0;
          while (uVar7 = (uint)puVar30, paVar19 = local_e8, puVar31 = local_f0, puVar30 < local_f0)
          {
            paVar19 = local_e8 + (long)puVar30;
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,(uVar7 & 1) + uVar7);
            local_b0 = (ulong *)CONCAT44(local_b0._4_4_,uVar8);
            uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>
                              ((Indexer *)&tangents,(uVar6 & 1) + uVar7);
            c_00 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,uVar7 + 2);
            uVar6 = (uint)(byte)((char)uVar6 + 1);
            SetFace(paVar19,(int)local_b0,uVar8,c_00);
            puVar30 = (ulong *)(ulong)(uVar7 + 1);
          }
          break;
        case 6:
          puVar31 = (ulong *)((long)puVar30 - 2);
          uVar27 = (long)puVar31 * 0x10 + 8;
          if ((ulong *)0xfffffffffffffff < puVar31) {
            uVar27 = 0xffffffffffffffff;
          }
          puVar17 = (undefined8 *)operator_new__(uVar27);
          *puVar17 = puVar31;
          paVar19 = (aiFace *)(puVar17 + 1);
          if (puVar31 != (ulong *)0x0) {
            paVar18 = paVar19;
            do {
              paVar18->mNumIndices = 0;
              paVar18->mIndices = (uint *)0x0;
              paVar18 = paVar18 + 1;
            } while (paVar18 != paVar19 + (long)puVar31);
          }
          uVar6 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,0);
          uVar7 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,1);
          uVar8 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,2);
          SetFace(paVar19,uVar6,uVar7,uVar8);
          uVar6 = 0;
          while( true ) {
            uVar7 = uVar6 + 1;
            if (puVar31 <= (ulong *)(ulong)uVar7) break;
            iVar22 = *(int *)puVar17[2];
            iVar23 = *(int *)(puVar17[(ulong)uVar6 * 2 + 2] + 8);
            uVar6 = glTF2::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)&tangents,uVar6 + 3)
            ;
            SetFace(paVar19 + (long)(ulong)uVar7,iVar22,iVar23,uVar6);
            uVar6 = uVar7;
          }
          break;
        default:
          goto switchD_0056d93c_default;
        }
        local_f0 = puVar31;
        uVar27 = (ulong)local_f0 & 0xffffffff;
        pMVar32 = local_a8;
        uVar6 = (uint)local_f0;
        goto LAB_0056e201;
      }
      uVar7 = *local_e0;
      if (6 < uVar7) goto switchD_0056d93c_default;
      uVar6 = aim->mNumVertices;
      uVar27 = (ulong)uVar6;
      switch(uVar7) {
      case 0:
        puVar30 = (ulong *)operator_new__(uVar27 * 0x10 + 8);
        *puVar30 = uVar27;
        paVar18 = (aiFace *)(puVar30 + 1);
        if (uVar6 != 0) {
          paVar19 = paVar18;
          do {
            paVar19->mNumIndices = 0;
            paVar19->mIndices = (uint *)0x0;
            paVar19 = paVar19 + 1;
          } while (paVar19 != paVar18 + uVar27);
        }
        local_e8 = paVar18;
        for (uVar20 = 0; paVar19 = local_e8, uVar27 != uVar20; uVar20 = uVar20 + 1) {
          SetFace(paVar18,(int)uVar20);
          paVar18 = paVar18 + 1;
        }
        break;
      case 1:
        uVar7 = uVar6;
        if ((uVar6 & 0xfffffffe) != uVar6) {
          pLVar13 = DefaultLogger::get();
          Logger::warn(pLVar13,
                       "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                      );
          uVar7 = uVar6 & 0xfffffffe;
        }
        uVar20 = (ulong)(uVar6 >> 1);
        puVar30 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
        *puVar30 = uVar20;
        paVar19 = (aiFace *)(puVar30 + 1);
        if (1 < uVar6) {
          paVar18 = paVar19;
          do {
            paVar18->mNumIndices = 0;
            paVar18->mIndices = (uint *)0x0;
            paVar18 = paVar18 + 1;
          } while (paVar18 != paVar19 + uVar20);
        }
        for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 2) {
          SetFace(paVar19 + (uVar6 >> 1),uVar6,uVar6 + 1);
        }
        goto LAB_0056e1e1;
      default:
        uVar7 = uVar6 - (uVar7 == 3);
        uVar20 = (ulong)uVar7;
        puVar30 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
        *puVar30 = uVar20;
        local_e8 = (aiFace *)(puVar30 + 1);
        if (uVar7 != 0) {
          paVar19 = local_e8;
          do {
            paVar19->mNumIndices = 0;
            paVar19->mIndices = (uint *)0x0;
            paVar19 = paVar19 + 1;
          } while (paVar19 != local_e8 + uVar20);
        }
        SetFace(local_e8,0,1);
        paVar19 = (aiFace *)(puVar30 + 3);
        local_b0 = puVar30;
        for (uVar26 = 2; uVar26 < uVar27; uVar26 = uVar26 + 1) {
          SetFace(paVar19,paVar19[-1].mIndices[1],(int)uVar26);
          paVar19 = paVar19 + 1;
        }
        paVar19 = local_e8;
        if (*local_e0 != 2) goto LAB_0056e1e1;
        SetFace(local_e8 + (uVar6 - 1),local_e8[uVar6 - 2].mIndices[1],*(int *)local_b0[2]);
        uVar27 = uVar20;
        uVar6 = uVar7;
        paVar19 = local_e8;
        break;
      case 4:
        uVar20 = uVar27 / 3;
        uVar7 = uVar6;
        if (uVar20 * 3 != uVar27) {
          pLVar13 = DefaultLogger::get();
          Logger::warn(pLVar13,
                       "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                      );
          uVar7 = (int)uVar20 * 3;
        }
        puVar30 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
        *puVar30 = uVar20;
        paVar19 = (aiFace *)(puVar30 + 1);
        if (2 < uVar6) {
          paVar18 = paVar19;
          do {
            paVar18->mNumIndices = 0;
            paVar18->mIndices = (uint *)0x0;
            paVar18 = paVar18 + 1;
          } while (paVar18 != paVar19 + uVar20);
        }
        for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 3) {
          SetFace(paVar19 + (ulong)uVar6 / 3,uVar6,uVar6 + 1,uVar6 + 2);
        }
LAB_0056e1e1:
        local_e8 = paVar19;
        uVar27 = uVar20;
        uVar6 = (uint)uVar20;
        paVar19 = local_e8;
        break;
      case 5:
        uVar6 = uVar6 - 2;
        uVar27 = (ulong)uVar6;
        puVar30 = (ulong *)operator_new__(uVar27 * 0x10 + 8);
        *puVar30 = uVar27;
        paVar19 = (aiFace *)(puVar30 + 1);
        if (uVar6 != 0) {
          paVar18 = paVar19;
          do {
            paVar18->mNumIndices = 0;
            paVar18->mIndices = (uint *)0x0;
            paVar18 = paVar18 + 1;
          } while (paVar18 != paVar19 + uVar27);
        }
        uVar20 = 0;
        paVar18 = paVar19;
        while (uVar27 != uVar20) {
          iVar22 = (int)uVar20;
          iVar23 = (int)(uVar20 + 1);
          b = iVar22;
          if ((uVar20 & 1) == 0) {
            b = iVar23;
            iVar23 = iVar22;
          }
          SetFace(paVar18,iVar23,b,iVar22 + 2);
          uVar20 = uVar20 + 1;
          paVar18 = paVar18 + 1;
        }
        break;
      case 6:
        uVar6 = uVar6 - 2;
        uVar27 = (ulong)uVar6;
        puVar30 = (ulong *)operator_new__(uVar27 * 0x10 + 8);
        *puVar30 = uVar27;
        local_e8 = (aiFace *)(puVar30 + 1);
        if (uVar6 != 0) {
          paVar19 = local_e8;
          do {
            paVar19->mNumIndices = 0;
            paVar19->mIndices = (uint *)0x0;
            paVar19 = paVar19 + 1;
          } while (paVar19 != local_e8 + uVar27);
        }
        SetFace(local_e8,0,1,2);
        paVar18 = (aiFace *)(puVar30 + 3);
        for (uVar20 = 1; paVar19 = local_e8, uVar20 < uVar27; uVar20 = uVar20 + 1) {
          SetFace(paVar18,*(int *)puVar30[2],paVar18[-1].mIndices[2],(int)uVar20 + 2);
          paVar18 = paVar18 + 1;
        }
      }
LAB_0056e201:
      local_e8 = paVar19;
      aim->mFaces = local_e8;
      aim->mNumFaces = uVar6;
      for (uVar20 = 0; uVar20 != uVar27; uVar20 = uVar20 + 1) {
        uVar26 = 0;
        while (local_e8[uVar20].mNumIndices != uVar26) {
          puVar25 = local_e8[uVar20].mIndices + uVar26;
          uVar26 = uVar26 + 1;
          if (aim->mNumVertices <= *puVar25) {
            if (uVar20 < uVar27) {
              __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                            ,0x281,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
            }
            goto switchD_0056d93c_default;
          }
        }
      }
switchD_0056d93c_default:
      if (*(long *)(local_e0 + 0x36) == 0) {
        uVar6 = local_90->mScene->mNumMaterials - 1;
      }
      else {
        uVar6 = local_e0[0x38];
      }
      aim->mMaterialIndex = uVar6;
      lVar24 = *(long *)&(pMVar32->primitives).
                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                         ._M_impl.super__Vector_impl_data;
      pPVar9 = *(pointer *)
                ((long)&(pMVar32->primitives).
                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                        ._M_impl + 8);
      uVar6 = (int)local_80 + 1;
    }
    uVar27 = local_88 + 1;
  } while( true );
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset &r) {
	std::vector<aiMesh *> meshes;

	unsigned int k = 0;

	for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
		Mesh &mesh = r.meshes[m];

		meshOffsets.push_back(k);
		k += unsigned(mesh.primitives.size());

		for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
			Mesh::Primitive &prim = mesh.primitives[p];

			aiMesh *aim = new aiMesh();
			meshes.push_back(aim);

			aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

			if (mesh.primitives.size() > 1) {
				ai_uint32 &len = aim->mName.length;
				aim->mName.data[len] = '-';
				len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
			}

			switch (prim.mode) {
				case PrimitiveMode_POINTS:
					aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
					break;

				case PrimitiveMode_LINES:
				case PrimitiveMode_LINE_LOOP:
				case PrimitiveMode_LINE_STRIP:
					aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
					break;

				case PrimitiveMode_TRIANGLES:
				case PrimitiveMode_TRIANGLE_STRIP:
				case PrimitiveMode_TRIANGLE_FAN:
					aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
					break;
			}

			Mesh::Primitive::Attributes &attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
				aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
				attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) {
				attr.normal[0]->ExtractData(aim->mNormals);

				// only extract tangents if normals are present
				if (attr.tangent.size() > 0 && attr.tangent[0]) {
					// generate bitangents from normals and tangents according to spec
					Tangent *tangents = nullptr;

					attr.tangent[0]->ExtractData(tangents);

					aim->mTangents = new aiVector3D[aim->mNumVertices];
					aim->mBitangents = new aiVector3D[aim->mNumVertices];

					for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
						aim->mTangents[i] = tangents[i].xyz;
						aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
					}

					delete[] tangents;
				}
			}

			for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
				if (attr.color[c]->count != aim->mNumVertices) {
					DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
											   "\" does not match the vertex count");
					continue;
				}
				attr.color[c]->ExtractData(aim->mColors[c]);
			}
			for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
				if (attr.texcoord[tc]->count != aim->mNumVertices) {
					DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
											   "\" does not match the vertex count");
					continue;
				}

				attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
				aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

				aiVector3D *values = aim->mTextureCoords[tc];
				for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
					values[i].y = 1 - values[i].y; // Flip Y coords
				}
			}

			std::vector<Mesh::Primitive::Target> &targets = prim.targets;
			if (targets.size() > 0) {
				aim->mNumAnimMeshes = (unsigned int)targets.size();
				aim->mAnimMeshes = new aiAnimMesh *[aim->mNumAnimMeshes];
				for (size_t i = 0; i < targets.size(); i++) {
					aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
					aiAnimMesh &aiAnimMesh = *(aim->mAnimMeshes[i]);
					Mesh::Primitive::Target &target = targets[i];

					if (target.position.size() > 0) {
						aiVector3D *positionDiff = nullptr;
						target.position[0]->ExtractData(positionDiff);
						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
							aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
						}
						delete[] positionDiff;
					}
					if (target.normal.size() > 0) {
						aiVector3D *normalDiff = nullptr;
						target.normal[0]->ExtractData(normalDiff);
						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
							aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
						}
						delete[] normalDiff;
					}
					if (target.tangent.size() > 0) {
						Tangent *tangent = nullptr;
						attr.tangent[0]->ExtractData(tangent);

						aiVector3D *tangentDiff = nullptr;
						target.tangent[0]->ExtractData(tangentDiff);

						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
							tangent[vertexId].xyz += tangentDiff[vertexId];
							aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
							aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
						}
						delete[] tangent;
						delete[] tangentDiff;
					}
					if (mesh.weights.size() > i) {
						aiAnimMesh.mWeight = mesh.weights[i];
					}
				}
			}

			aiFace *faces = nullptr;
			size_t nFaces = 0;

			if (prim.indices) {
				size_t count = prim.indices->count;

				Accessor::Indexer data = prim.indices->GetIndexer();
				ai_assert(data.IsValid());

				switch (prim.mode) {
					case PrimitiveMode_POINTS: {
						nFaces = count;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; ++i) {
							SetFace(faces[i], data.GetUInt(i));
						}
						break;
					}

					case PrimitiveMode_LINES: {
						nFaces = count / 2;
						if (nFaces * 2 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
							count = nFaces * 2;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 2) {
							SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
						}
						break;
					}

					case PrimitiveMode_LINE_LOOP:
					case PrimitiveMode_LINE_STRIP: {
						nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
						faces = new aiFace[nFaces];
						SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
						for (unsigned int i = 2; i < count; ++i) {
							SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
						}
						if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
							SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
						}
						break;
					}

					case PrimitiveMode_TRIANGLES: {
						nFaces = count / 3;
						if (nFaces * 3 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
							count = nFaces * 3;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 3) {
							SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_STRIP: {
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < nFaces; ++i) {
							//The ordering is to ensure that the triangles are all drawn with the same orientation
							if ((i + 1) % 2 == 0) {
								//For even n, vertices n + 1, n, and n + 2 define triangle n
								SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
							} else {
								//For odd n, vertices n, n+1, and n+2 define triangle n
								SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
							}
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_FAN:
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
						for (unsigned int i = 1; i < nFaces; ++i) {
							SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
						}
						break;
				}
			} else { // no indices provided so directly generate from counts

				// use the already determined count as it includes checks
				unsigned int count = aim->mNumVertices;

				switch (prim.mode) {
					case PrimitiveMode_POINTS: {
						nFaces = count;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; ++i) {
							SetFace(faces[i], i);
						}
						break;
					}

					case PrimitiveMode_LINES: {
						nFaces = count / 2;
						if (nFaces * 2 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
							count = (unsigned int)nFaces * 2;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 2) {
							SetFace(faces[i / 2], i, i + 1);
						}
						break;
					}

					case PrimitiveMode_LINE_LOOP:
					case PrimitiveMode_LINE_STRIP: {
						nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
						faces = new aiFace[nFaces];
						SetFace(faces[0], 0, 1);
						for (unsigned int i = 2; i < count; ++i) {
							SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
						}
						if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
							SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
						}
						break;
					}

					case PrimitiveMode_TRIANGLES: {
						nFaces = count / 3;
						if (nFaces * 3 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
							count = (unsigned int)nFaces * 3;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 3) {
							SetFace(faces[i / 3], i, i + 1, i + 2);
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_STRIP: {
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < nFaces; ++i) {
							//The ordering is to ensure that the triangles are all drawn with the same orientation
							if ((i + 1) % 2 == 0) {
								//For even n, vertices n + 1, n, and n + 2 define triangle n
								SetFace(faces[i], i + 1, i, i + 2);
							} else {
								//For odd n, vertices n, n+1, and n+2 define triangle n
								SetFace(faces[i], i, i + 1, i + 2);
							}
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_FAN:
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						SetFace(faces[0], 0, 1, 2);
						for (unsigned int i = 1; i < nFaces; ++i) {
							SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
						}
						break;
				}
			}

			if (nullptr != faces) {
				aim->mFaces = faces;
				aim->mNumFaces = static_cast<unsigned int>(nFaces);
				ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
			}

			if (prim.material) {
				aim->mMaterialIndex = prim.material.GetIndex();
			} else {
				aim->mMaterialIndex = mScene->mNumMaterials - 1;
			}
		}
	}

	meshOffsets.push_back(k);

	CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}